

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

void __thiscall
iutest::AssertionHelper::ScopedTrace::append_message
          (ScopedTrace *this,TestPartResult *part_result,bool isException)

{
  TestInfo *pTVar1;
  pointer in_RCX;
  undefined7 in_register_00000011;
  _List_node_base *p_Var2;
  string str;
  allocator<char> local_81;
  long *local_80 [2];
  long local_70 [2];
  undefined4 local_5c;
  _List_node_base *local_58;
  string local_50;
  
  if (((this->list).
       super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
       ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) ||
     ((((Test::Observer<void>::s_current != (Test *)0x0 &&
        (Test::Observer<void>::s_current->m_test_info != (iuITestInfoMediator *)0x0)) &&
       (pTVar1 = Test::Observer<void>::s_current->m_test_info->m_test_info,
       pTVar1 != (TestInfo *)0x0)) &&
      (in_RCX = (pTVar1->m_uncaught_messages).
                super__Vector_base<iutest::detail::iuCodeMessage,_std::allocator<iutest::detail::iuCodeMessage>_>
                ._M_impl.super__Vector_impl_data._M_start,
      in_RCX != (pTVar1->m_uncaught_messages).
                super__Vector_base<iutest::detail::iuCodeMessage,_std::allocator<iutest::detail::iuCodeMessage>_>
                ._M_impl.super__Vector_impl_data._M_finish)))) {
    local_80[0] = local_70;
    local_58 = (_List_node_base *)this;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"\niutest trace:","");
    std::__cxx11::string::_M_append((char *)part_result,(ulong)local_80[0]);
    local_5c = (undefined4)CONCAT71(in_register_00000011,isException);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    p_Var2 = (((msg_list *)&local_58->_M_next)->
             super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 != local_58) {
      do {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"\n","");
        std::__cxx11::string::_M_append((char *)part_result,(ulong)local_80[0]);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        detail::FormatFileLocation_abi_cxx11_
                  (&local_50,
                   *(detail **)
                    (*(size_t *)
                      &((msg_list *)(p_Var2 + 1))->
                       super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
                    + 0x20),(char *)(ulong)*(uint *)(*(size_t *)
                                                      &((msg_list *)(p_Var2 + 1))->
                                                                                                              
                                                  super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
                                                  + 0x28),(int)in_RCX);
        std::__cxx11::string::append((char *)&local_50);
        std::__cxx11::string::append((char *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_80,local_50._M_dataplus._M_p,&local_81);
        std::__cxx11::string::_M_append((char *)part_result,(ulong)local_80[0]);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        p_Var2 = (((msg_list *)&p_Var2->_M_next)->
                 super__List_base<iutest::AssertionHelper::ScopedMessage_*,_std::allocator<iutest::AssertionHelper::ScopedMessage_*>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
      } while (p_Var2 != local_58);
    }
    if ((char)local_5c != '\0') {
      detail::UncaughtScopedTrace::Get_abi_cxx11_();
      std::__cxx11::string::_M_append((char *)part_result,(ulong)local_80[0]);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void append_message(TestPartResult& part_result, bool isException)
        {
            if( !list.empty() || detail::UncaughtScopedTrace::Has() )
            {
                part_result.add_message("\niutest trace:");
                // TODO : 追加メッセージとして保存するべき
                // 現状はテスト結果のメッセージに追加している。
                for( msg_list::iterator it = list.begin(), end=list.end(); it != end; ++it )
                {
                    part_result.add_message("\n");
                    part_result.add_message((*it)->make_message().c_str());
                }
                if( isException )
                {
                    part_result.add_message(detail::UncaughtScopedTrace::Get());
                }
            }
        }